

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O3

int trico_read_triangles(void *a,uint32_t **triangles)

{
  int *__src;
  uint *puVar1;
  long lVar2;
  int *piVar3;
  uint *puVar4;
  uint nr_of_indices;
  uint uVar5;
  char *pcVar6;
  uint8_t *b1;
  uint8_t *b2;
  uint8_t *b3;
  uint8_t *b4;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  iVar7 = 0;
  iVar8 = 0;
  if ((*(int *)((long)a + 0x24) == 3) && (iVar8 = iVar7, *(int *)((long)a + 0x40) == 0)) {
    lVar2 = *(long *)((long)a + 0x10);
    piVar3 = *(int **)((long)a + 0x18);
    uVar11 = *(ulong *)((long)a + 0x30);
    if ((ulong)((long)piVar3 + (4 - lVar2)) <= uVar11) {
      iVar7 = *piVar3;
      *(int **)((long)a + 0x18) = piVar3 + 1;
      if ((ulong)((long)(piVar3 + 1) + (4 - lVar2)) <= uVar11) {
        uVar5 = piVar3[1];
        uVar9 = (ulong)uVar5;
        __src = piVar3 + 2;
        *(int **)((long)a + 0x18) = __src;
        pcVar6 = (char *)malloc(uVar9);
        if ((long)piVar3 + ((uVar9 + 8) - lVar2) <= uVar11) {
          memcpy(pcVar6,__src,uVar9);
          *(ulong *)((long)a + 0x18) = (long)__src + uVar9;
          nr_of_indices = iVar7 * 3;
          uVar11 = (ulong)nr_of_indices;
          b1 = (uint8_t *)malloc(uVar11);
          uVar5 = LZ4_decompress_safe(pcVar6,(char *)b1,uVar5,nr_of_indices);
          if (uVar5 != nr_of_indices) {
            __assert_fail("bytes_decompressed == nr_of_triangles * 3",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                          ,0x44e,"int trico_read_triangles(void *, uint32_t **)");
          }
          if (*(int *)((long)a + 0x40) == 0) {
            lVar2 = *(long *)((long)a + 0x10);
            puVar4 = *(uint **)((long)a + 0x18);
            uVar9 = *(ulong *)((long)a + 0x30);
            if ((ulong)((long)puVar4 + (4 - lVar2)) <= uVar9) {
              uVar5 = *puVar4;
              uVar10 = (ulong)uVar5;
              puVar1 = puVar4 + 1;
              *(uint **)((long)a + 0x18) = puVar1;
              pcVar6 = (char *)realloc(pcVar6,uVar10);
              if ((long)puVar4 + ((uVar10 + 4) - lVar2) <= uVar9) {
                memcpy(pcVar6,puVar1,uVar10);
                *(ulong *)((long)a + 0x18) = (long)puVar1 + uVar10;
                b2 = (uint8_t *)malloc(uVar11);
                uVar5 = LZ4_decompress_safe(pcVar6,(char *)b2,uVar5,nr_of_indices);
                if (uVar5 != nr_of_indices) {
                  __assert_fail("bytes_decompressed == nr_of_triangles * 3",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                                ,0x457,"int trico_read_triangles(void *, uint32_t **)");
                }
                if (*(int *)((long)a + 0x40) == 0) {
                  lVar2 = *(long *)((long)a + 0x10);
                  puVar4 = *(uint **)((long)a + 0x18);
                  uVar9 = *(ulong *)((long)a + 0x30);
                  if ((ulong)((long)puVar4 + (4 - lVar2)) <= uVar9) {
                    uVar5 = *puVar4;
                    uVar10 = (ulong)uVar5;
                    puVar1 = puVar4 + 1;
                    *(uint **)((long)a + 0x18) = puVar1;
                    pcVar6 = (char *)realloc(pcVar6,uVar10);
                    if ((long)puVar4 + ((uVar10 + 4) - lVar2) <= uVar9) {
                      memcpy(pcVar6,puVar1,uVar10);
                      *(ulong *)((long)a + 0x18) = (long)puVar1 + uVar10;
                      b3 = (uint8_t *)malloc(uVar11);
                      uVar5 = LZ4_decompress_safe(pcVar6,(char *)b3,uVar5,nr_of_indices);
                      if (uVar5 != nr_of_indices) {
                        __assert_fail("bytes_decompressed == nr_of_triangles * 3",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                                      ,0x460,"int trico_read_triangles(void *, uint32_t **)");
                      }
                      if (*(int *)((long)a + 0x40) == 0) {
                        lVar2 = *(long *)((long)a + 0x10);
                        puVar4 = *(uint **)((long)a + 0x18);
                        uVar9 = *(ulong *)((long)a + 0x30);
                        if ((ulong)((long)puVar4 + (4 - lVar2)) <= uVar9) {
                          uVar5 = *puVar4;
                          uVar10 = (ulong)uVar5;
                          puVar1 = puVar4 + 1;
                          *(uint **)((long)a + 0x18) = puVar1;
                          pcVar6 = (char *)realloc(pcVar6,uVar10);
                          if ((long)puVar4 + ((uVar10 + 4) - lVar2) <= uVar9) {
                            memcpy(pcVar6,puVar1,uVar10);
                            *(ulong *)((long)a + 0x18) = (long)puVar1 + uVar10;
                            b4 = (uint8_t *)malloc(uVar11);
                            uVar5 = LZ4_decompress_safe(pcVar6,(char *)b4,uVar5,nr_of_indices);
                            if (uVar5 != nr_of_indices) {
                              __assert_fail("bytes_decompressed == nr_of_triangles * 3",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                                            ,0x469,"int trico_read_triangles(void *, uint32_t **)");
                            }
                            if (triangles != (uint32_t **)0x0) {
                              trico_transpose_uint32_soa_to_aos(triangles,b1,b2,b3,b4,nr_of_indices)
                              ;
                            }
                            free(pcVar6);
                            free(b1);
                            free(b2);
                            free(b3);
                            free(b4);
                            read_next_stream_type((trico_archive *)a);
                            iVar8 = 1;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar8;
}

Assistant:

int trico_read_triangles(void* a, uint32_t** triangles)
  {
  struct trico_archive* arch = (struct trico_archive*)a;
  if (trico_get_next_stream_type(arch) != trico_triangle_uint32_stream)
    return 0;

  uint32_t nr_of_triangles;
  if (!read(&nr_of_triangles, sizeof(uint32_t), 1, arch))
    return 0;

  uint32_t nr_of_compressed_bytes;
  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  void* compressed = trico_malloc(nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint8_t* decompressed_b1 = (uint8_t*)trico_malloc(nr_of_triangles * 3);
  uint32_t bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)decompressed_b1, nr_of_compressed_bytes, nr_of_triangles * 3);
  assert(bytes_decompressed == nr_of_triangles * 3);

  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  compressed = trico_realloc(compressed, nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint8_t* decompressed_b2 = (uint8_t*)trico_malloc(nr_of_triangles * 3);
  bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)decompressed_b2, nr_of_compressed_bytes, nr_of_triangles * 3);
  assert(bytes_decompressed == nr_of_triangles * 3);

  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  compressed = trico_realloc(compressed, nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint8_t* decompressed_b3 = (uint8_t*)trico_malloc(nr_of_triangles * 3);
  bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)decompressed_b3, nr_of_compressed_bytes, nr_of_triangles * 3);
  assert(bytes_decompressed == nr_of_triangles * 3);

  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  compressed = trico_realloc(compressed, nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint8_t* decompressed_b4 = (uint8_t*)trico_malloc(nr_of_triangles * 3);
  bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)decompressed_b4, nr_of_compressed_bytes, nr_of_triangles * 3);
  assert(bytes_decompressed == nr_of_triangles * 3);

  if (triangles != NULL)
    trico_transpose_uint32_soa_to_aos(triangles, decompressed_b1, decompressed_b2, decompressed_b3, decompressed_b4, nr_of_triangles * 3);

  trico_free(compressed);
  trico_free(decompressed_b1);
  trico_free(decompressed_b2);
  trico_free(decompressed_b3);
  trico_free(decompressed_b4);

  read_next_stream_type(arch);

  return 1;
  }